

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sighash_tests.cpp
# Opt level: O2

void __thiscall
SigHashTest::RandomTransaction(SigHashTest *this,CMutableTransaction *tx,bool fSingle)

{
  FastRandomContext *rng;
  pointer pCVar1;
  pointer pCVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  uint64_t uVar6;
  CAmount CVar7;
  int iVar8;
  int iVar9;
  long in_FS_OFFSET;
  uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  rng = &(this->super_BasicTestingSetup).m_rng;
  uVar6 = RandomMixin<FastRandomContext>::randbits<32>(&rng->super_RandomMixin<FastRandomContext>);
  tx->version = (uint32_t)uVar6;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::clear(&tx->vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::clear(&tx->vout);
  bVar3 = RandomMixin<FastRandomContext>::randbool(&rng->super_RandomMixin<FastRandomContext>);
  uVar4 = 0;
  if (bVar3) {
    uVar6 = RandomMixin<FastRandomContext>::randbits<32>(&rng->super_RandomMixin<FastRandomContext>)
    ;
    uVar4 = (uint32_t)uVar6;
  }
  tx->nLockTime = uVar4;
  uVar6 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,2);
  iVar9 = (int)uVar6 + 1;
  iVar5 = iVar9;
  if (!fSingle) {
    uVar6 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,2);
    iVar5 = (int)uVar6 + 1;
  }
  iVar8 = 0;
  if (0 < iVar9) {
    iVar8 = iVar9;
  }
  while (iVar8 != 0) {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<>(&tx->vin);
    pCVar1 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    RandomMixin<FastRandomContext>::rand256(&local_58,&rng->super_RandomMixin<FastRandomContext>);
    *(undefined8 *)(pCVar1[-1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10)
         = local_58.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)(pCVar1[-1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18)
         = local_58.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)pCVar1[-1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
         local_58.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)(pCVar1[-1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
         local_58.super_base_blob<256U>.m_data._M_elems._8_8_;
    uVar6 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,2);
    pCVar1[-1].prevout.n = (uint32_t)uVar6;
    RandomScript(this,&pCVar1[-1].scriptSig);
    bVar3 = RandomMixin<FastRandomContext>::randbool(&rng->super_RandomMixin<FastRandomContext>);
    uVar4 = 0xffffffff;
    if (bVar3) {
      uVar6 = RandomMixin<FastRandomContext>::randbits<32>
                        (&rng->super_RandomMixin<FastRandomContext>);
      uVar4 = (uint32_t)uVar6;
    }
    pCVar1[-1].nSequence = uVar4;
    iVar8 = iVar8 + -1;
  }
  iVar9 = 0;
  if (0 < iVar5) {
    iVar9 = iVar5;
  }
  while (iVar9 != 0) {
    std::vector<CTxOut,_std::allocator<CTxOut>_>::emplace_back<>(&tx->vout);
    pCVar2 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_finish;
    CVar7 = RandMoney<FastRandomContext_&>(rng);
    pCVar2[-1].nValue = CVar7;
    RandomScript(this,&pCVar2[-1].scriptPubKey);
    iVar9 = iVar9 + -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void RandomTransaction(CMutableTransaction& tx, bool fSingle)
{
    tx.version = m_rng.rand32();
    tx.vin.clear();
    tx.vout.clear();
    tx.nLockTime = (m_rng.randbool()) ? m_rng.rand32() : 0;
    int ins = (m_rng.randbits(2)) + 1;
    int outs = fSingle ? ins : (m_rng.randbits(2)) + 1;
    for (int in = 0; in < ins; in++) {
        tx.vin.emplace_back();
        CTxIn &txin = tx.vin.back();
        txin.prevout.hash = Txid::FromUint256(m_rng.rand256());
        txin.prevout.n = m_rng.randbits(2);
        RandomScript(txin.scriptSig);
        txin.nSequence = (m_rng.randbool()) ? m_rng.rand32() : std::numeric_limits<uint32_t>::max();
    }
    for (int out = 0; out < outs; out++) {
        tx.vout.emplace_back();
        CTxOut &txout = tx.vout.back();
        txout.nValue = RandMoney(m_rng);
        RandomScript(txout.scriptPubKey);
    }
}